

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::anon_unknown_0::LineBufferTask::execute(LineBufferTask_conflict *this)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  long in_RDI;
  exception *e;
  char *endPtr;
  char *writePtr;
  intptr_t linePtr;
  intptr_t base;
  int dMaxX;
  int dMinX;
  InSliceInfo_conflict *slice;
  uint i_1;
  char *readPtr;
  char *in_stack_00000080;
  int y;
  int dy;
  int yStop;
  int yStart;
  int i;
  int maxY;
  size_t uncompressedSize;
  PixelType in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  char **in_stack_ffffffffffffff80;
  uint local_44;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_18;
  ulong local_10;
  
  if (**(long **)(in_RDI + 0x18) == 0) {
    local_10 = 0;
    piVar3 = std::min<int>((int *)(*(long *)(in_RDI + 0x18) + 0x18),
                           (int *)(*(long *)(in_RDI + 0x10) + 0xa8));
    iVar2 = *piVar3;
    for (local_18 = *(int *)(*(long *)(in_RDI + 0x18) + 0x14) -
                    *(int *)(*(long *)(in_RDI + 0x10) + 0xa4);
        local_18 <= iVar2 - *(int *)(*(long *)(in_RDI + 0x10) + 0xa4); local_18 = local_18 + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (*(long *)(in_RDI + 0x10) + 0xd0),(long)local_18);
      local_10 = *pvVar4 + local_10;
    }
    if ((*(long *)(*(long *)(in_RDI + 0x18) + 0x20) == 0) ||
       (local_10 <= (ulong)(long)*(int *)(*(long *)(in_RDI + 0x18) + 0x10))) {
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x28) = 1;
      **(undefined8 **)(in_RDI + 0x18) = *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8);
    }
    else {
      in_stack_ffffffffffffff74 =
           (**(code **)(**(long **)(*(long *)(in_RDI + 0x18) + 0x20) + 0x18))();
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x28) = in_stack_ffffffffffffff74;
      lVar1 = *(long *)(in_RDI + 0x18);
      in_stack_ffffffffffffff70 =
           (**(code **)(**(long **)(lVar1 + 0x20) + 0x30))
                     (*(long **)(lVar1 + 0x20),*(undefined8 *)(lVar1 + 8),
                      *(undefined4 *)(lVar1 + 0x10),*(undefined4 *)(lVar1 + 0x14));
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x10) = in_stack_ffffffffffffff70;
    }
  }
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0x98) == 0) {
    local_28 = *(int *)(in_RDI + 0x20);
    local_2c = *(int *)(in_RDI + 0x24) + 1;
    local_30 = 1;
  }
  else {
    local_28 = *(int *)(in_RDI + 0x24);
    local_2c = *(int *)(in_RDI + 0x20) + -1;
    local_30 = -1;
  }
  for (local_34 = local_28; local_34 != local_2c; local_34 = local_30 + local_34) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (*(long *)(in_RDI + 0x10) + 0xe8),
               (long)(local_34 - *(int *)(*(long *)(in_RDI + 0x10) + 0xa4)));
    for (local_44 = 0;
        sVar5 = std::
                vector<Imf_3_2::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo>_>
                ::size((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo>_>
                        *)(*(long *)(in_RDI + 0x10) + 0x100)), local_44 < sVar5;
        local_44 = local_44 + 1) {
      pvVar6 = std::
               vector<Imf_3_2::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo>_>
               ::operator[]((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo>_>
                             *)(*(long *)(in_RDI + 0x10) + 0x100),(ulong)local_44);
      iVar2 = Imath_3_2::modp(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      if (iVar2 == 0) {
        Imath_3_2::divp(*(int *)(*(long *)(in_RDI + 0x10) + 0x9c),pvVar6->xSampling);
        Imath_3_2::divp(*(int *)(*(long *)(in_RDI + 0x10) + 0xa0),pvVar6->xSampling);
        if ((pvVar6->skip & 1U) == 0) {
          Imath_3_2::divp(local_34,pvVar6->ySampling);
          in_stack_ffffffffffffff50 = pvVar6->typeInFile;
          copyIntoFrameBuffer(_yStart,_dy,in_stack_00000080,(size_t)readPtr,i_1._3_1_,(double)slice,
                              dMinX,i,(PixelType)uncompressedSize);
        }
        else {
          skipChannel(in_stack_ffffffffffffff80,(PixelType)((ulong)in_RDI >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        }
      }
    }
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //

        if (_lineBuffer->uncompressedData == 0)
        {
            uint64_t uncompressedSize = 0;
            int      maxY             = min (_lineBuffer->maxY, _ifd->maxY);

            for (int i = _lineBuffer->minY - _ifd->minY; i <= maxY - _ifd->minY;
                 ++i)
            {
                uncompressedSize += (int) _ifd->bytesPerLine[i];
            }

            //
            // Create the compressor everytime when we want to use it,
            // because we don't know maxBytesPerLine beforehand.
            // (TODO) optimize this. don't do this every time.
            //

            if (_lineBuffer->compressor != 0) delete _lineBuffer->compressor;
            uint64_t maxBytesPerLine = 0;
            for (int i = _lineBuffer->minY - _ifd->minY; i <= maxY - _ifd->minY;
                 ++i)
            {
                if (_ifd->bytesPerLine[i] > maxBytesPerLine)
                    maxBytesPerLine = _ifd->bytesPerLine[i];
            }
            _lineBuffer->compressor = newCompressor (
                _ifd->header.compression (), maxBytesPerLine, _ifd->header);

            if (_lineBuffer->compressor &&
                _lineBuffer->packedDataSize < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format ();

                _lineBuffer->packedDataSize =
                    _lineBuffer->compressor->uncompress (
                        _lineBuffer->buffer,
                        static_cast<int> (_lineBuffer->packedDataSize),
                        _lineBuffer->minY,
                        _lineBuffer->uncompressedData);

                if (_lineBuffer->unpackedDataSize !=
                    _lineBuffer->packedDataSize)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Incorrect size for decompressed data. Expected "
                            << _lineBuffer->unpackedDataSize << " got "
                            << _lineBuffer->packedDataSize << " bytes");
                }
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //

                _lineBuffer->format           = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;

                if (_lineBuffer->packedDataSize != maxBytesPerLine)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Incorrect size for uncompressed data. Expected "
                            << maxBytesPerLine << " got "
                            << _lineBuffer->packedDataSize << " bytes");
                }
            }
        }

        int yStart, yStop, dy;

        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop  = _scanLineMax + 1;
            dy     = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop  = _scanLineMin - 1;
            dy     = -1;
        }

        for (int y = yStart; y != yStop; y += dy)
        {
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //

            const char* readPtr = _lineBuffer->uncompressedData +
                                  _ifd->offsetInLineBuffer[y - _ifd->minY];

            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size (); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
                // (the scan line contains data only if y % ySampling == 0).
                //

                InSliceInfo& slice = *_ifd->slices[i];

                if (modp (y, slice.ySampling) != 0) continue;

                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (
                        readPtr,
                        slice.typeInFile,
                        _ifd->lineSampleCount[y - _ifd->minY]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    int width = (_ifd->maxX - _ifd->minX + 1);

                    ptrdiff_t base;

                    if (_ifd->bigFile)
                    {
                        base = reinterpret_cast<ptrdiff_t> (
                            &_lineBuffer->_tempCountBuffer[0][0]);
                        base -= sizeof (unsigned int) * _ifd->minX;
                        base -= sizeof (unsigned int) *
                                static_cast<ptrdiff_t> (_lineBuffer->minY) *
                                static_cast<ptrdiff_t> (width);
                    }
                    else
                    {
                        base = reinterpret_cast<ptrdiff_t> (
                            &_ifd->sampleCount[0][0]);
                        base -= sizeof (unsigned int) * _ifd->minX;
                        base -= sizeof (unsigned int) *
                                static_cast<ptrdiff_t> (_ifd->minY) *
                                static_cast<ptrdiff_t> (width);
                    }

                    copyIntoDeepFrameBuffer (
                        readPtr,
                        slice.base,
                        reinterpret_cast<char*> (base),
                        sizeof (unsigned int) * 1,
                        sizeof (unsigned int) * width,
                        y,
                        _ifd->minX,
                        _ifd->maxX,
                        0,
                        0,
                        0,
                        0,
                        slice.sampleStride,
                        slice.xPointerStride,
                        slice.yPointerStride,
                        slice.fill,
                        slice.fillValue,
                        _lineBuffer->format,
                        slice.typeInFrameBuffer,
                        slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = e.what ();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}